

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewSymbolTreeVisitor.cpp
# Opt level: O2

void __thiscall
NewSymbolTreeVisitor::Visit(NewSymbolTreeVisitor *this,ArrayAccessExpression *expression)

{
  NewScopeLayer *this_00;
  Symbol local_60;
  string local_40;
  
  this_00 = this->current_layer_;
  std::__cxx11::string::string((string *)&local_40,(string *)&expression->array_indent_);
  Symbol::Symbol(&local_60,&local_40);
  NewScopeLayer::GetArrayLayer(this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  (**(expression->index_expression_->super_Node)._vptr_Node)(expression->index_expression_,this);
  return;
}

Assistant:

void NewSymbolTreeVisitor::Visit(ArrayAccessExpression* expression) {
  current_layer_->GetArrayLayer(Symbol(expression->array_indent_));

  expression->index_expression_->Accept(this);
}